

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

IDiagObjectAddress * __thiscall
Js::RecyclableProtoObjectWalker::FindPropertyAddress
          (RecyclableProtoObjectWalker *this,PropertyId propId,bool *isConst)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IDiagObjectAddress *local_b0;
  undefined1 local_70 [8];
  AutoCleanup autoCleanup;
  ResolvedObject resolvedProto;
  bool *isConst_local;
  PropertyId propId_local;
  RecyclableProtoObjectWalker *this_local;
  
  ResolvedObject::ResolvedObject((ResolvedObject *)&autoCleanup.walker);
  (*(this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase[2])(this,&autoCleanup.walker);
  FindPropertyAddress::AutoCleanup::AutoCleanup((AutoCleanup *)local_70);
  if (resolvedProto.address == (IDiagObjectAddress *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd91,"(resolvedProto.objectDisplay)","resolvedProto.objectDisplay"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*(resolvedProto.address)->_vptr_IDiagObjectAddress[7])();
  local_70 = (undefined1  [8])CONCAT44(extraout_var,iVar3);
  autoCleanup.walkerRef =
       (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
       Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::GetStrongReference
                 ((WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)local_70);
  if (autoCleanup.walkerRef == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
    local_b0 = (IDiagObjectAddress *)0x0;
  }
  else {
    iVar3 = (**(code **)(((autoCleanup.walkerRef)->adapter->adapterLock).super_CCLock.mutexPtr + 8))
                      (autoCleanup.walkerRef,(ulong)(uint)propId,isConst);
    local_b0 = (IDiagObjectAddress *)CONCAT44(extraout_var_00,iVar3);
  }
  FindPropertyAddress::AutoCleanup::~AutoCleanup((AutoCleanup *)local_70);
  return local_b0;
}

Assistant:

IDiagObjectAddress* RecyclableProtoObjectWalker::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        ResolvedObject resolvedProto;
        GetGroupObject(&resolvedProto);

        struct AutoCleanup
        {
            WeakArenaReference<Js::IDiagObjectModelWalkerBase> * walkerRef;
            IDiagObjectModelWalkerBase * walker;

            AutoCleanup() : walkerRef(nullptr), walker(nullptr) {};
            ~AutoCleanup()
            {
                if (walker)
                {
                    walkerRef->ReleaseStrongReference();
                }
                if (walkerRef)
                {
                    HeapDelete(walkerRef);
                }
            }
        } autoCleanup;
        Assert(resolvedProto.objectDisplay);
        autoCleanup.walkerRef = resolvedProto.objectDisplay->CreateWalker();
        autoCleanup.walker = autoCleanup.walkerRef->GetStrongReference();
        return autoCleanup.walker ? autoCleanup.walker->FindPropertyAddress(propId, isConst) : nullptr;
    }